

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O1

void __thiscall
QueryTests_Update_canDetermineSpecificationForUpdate_Test::TestBody
          (QueryTests_Update_canDetermineSpecificationForUpdate_Test *this)

{
  char *pcVar1;
  size_type *psVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer *this_00;
  long *plVar7;
  char *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_03;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_05;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_;
  api_insert_update_type update_data2;
  api_filter_type filter2;
  api_insert_update_type update_data1;
  Query query_update2;
  api_filter_type filter1;
  Query query_update1;
  allocator_type local_42c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_42b;
  allocator_type local_42a;
  allocator_type local_429;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_428;
  long *local_400 [2];
  long local_3f0 [2];
  undefined4 local_3e0;
  undefined1 local_3d8 [88];
  pointer local_380 [3];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_338;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
  local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  undefined1 local_298 [36];
  TransactionType local_274;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
  local_1b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
  local_170;
  Query local_140;
  
  database::Query::Query
            (&local_140,
             "update company.employee set employee_name = Tim,employee_status = fulltime where employee_id = 1"
            );
  local_3d8[0] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_140.m_transaction_type == update);
  local_3d8._8_8_ = 0;
  if (local_140.m_transaction_type == update) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_3d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_3d8[0] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_140.m_transaction_metatype == dml);
    local_3d8._8_8_ = 0;
    if (local_140.m_transaction_metatype == dml) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_3d8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar3 = local_298 + 0x10;
      local_298._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_298,local_140.m_database_name._M_dataplus._M_p,
                 local_140.m_database_name._M_dataplus._M_p +
                 local_140.m_database_name._M_string_length);
      iVar5 = std::__cxx11::string::compare(local_298);
      local_3d8[0] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(iVar5 == 0);
      local_3d8._8_8_ = 0;
      if ((char *)local_298._0_8_ != pcVar3) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      if (local_3d8[0] ==
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
          0x0) {
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_298,(internal *)local_3d8,
                   (AssertionResult *)"query_update1.databaseName() == \"company\"","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0xaf,(char *)local_298._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_428)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
        if ((char *)local_298._0_8_ != pcVar3) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        if ((long *)local_428.first._M_dataplus._M_p != (long *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && ((long *)local_428.first._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_428.first._M_dataplus._M_p + 8))();
          }
          local_428.first._M_dataplus._M_p = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_3d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_3d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_298._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,local_140.m_container_name._M_dataplus._M_p,
                   local_140.m_container_name._M_dataplus._M_p +
                   local_140.m_container_name._M_string_length);
        iVar5 = std::__cxx11::string::compare((char *)local_298);
        local_3d8[0] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(iVar5 == 0);
        local_3d8._8_8_ = 0;
        if ((char *)local_298._0_8_ != pcVar3) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        if (local_3d8[0] ==
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
            0x0) {
          testing::Message::Message((Message *)&local_428);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_298,(internal *)local_3d8,
                     (AssertionResult *)"query_update1.containerName() == \"employee\"","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_2c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                     ,0xb0,(char *)local_298._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_2c8,(Message *)&local_428);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
          if ((char *)local_298._0_8_ != pcVar3) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          if ((long *)local_428.first._M_dataplus._M_p != (long *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && ((long *)local_428.first._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_428.first._M_dataplus._M_p + 8))();
            }
            local_428.first._M_dataplus._M_p = (pointer)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_3d8 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_3d8 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[14],_const_char_(&)[4],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_298,(char (*) [14])"employee_name",(char (*) [4])"Tim");
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[16],_const_char_(&)[9],_true>
                    (&local_258,(char (*) [16])"employee_status",(char (*) [9])"fulltime");
          __l._M_len = 2;
          __l._M_array = (iterator)local_298;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_2c8,__l,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3d8,(allocator_type *)&local_428);
          lVar6 = -0x80;
          paVar8 = &local_258.second.field_2;
          do {
            if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar8->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                              paVar8->_M_allocated_capacity + 1);
            }
            if (&paVar8->_M_allocated_capacity + -4 !=
                (size_type *)(&paVar8->_M_allocated_capacity)[-6]) {
              operator_delete((size_type *)(&paVar8->_M_allocated_capacity)[-6],
                              (&paVar8->_M_allocated_capacity)[-4] + 1);
            }
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(&paVar8->_M_allocated_capacity + -8);
            lVar6 = lVar6 + 0x40;
          } while (lVar6 != 0);
          pcVar1 = local_3d8 + 0x10;
          local_3d8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"1","");
          local_3d8._32_4_ = equal_to;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_3d8;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    *)&local_428,__l_00,(allocator_type *)&local_368);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[12],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      *)local_298,(char (*) [12])"employee_id",
                     (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      *)&local_428);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_298;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                 *)&local_170,__l_01,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_2f8,(allocator_type *)&local_338);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                     *)(local_298 + 0x20));
          if ((char *)local_298._0_8_ != pcVar3) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                     *)&local_428);
          if ((char *)local_3d8._0_8_ != pcVar1) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_298,&local_140.m_values._M_t);
          if (local_270._M_p == (pointer)local_2c8._M_impl.super__Rb_tree_header._M_node_count) {
            bVar4 = std::__equal<false>::
                    equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )local_298._24_8_,(_Base_ptr)(local_298 + 8),
                               (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )local_2c8._M_impl.super__Rb_tree_header._M_header._M_left);
          }
          else {
            bVar4 = false;
          }
          local_3d8[0] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )bVar4;
          local_3d8._8_8_ = 0;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_298);
          if (local_3d8[0] ==
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )0x0) {
            testing::Message::Message((Message *)&local_428);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_298,(internal *)local_3d8,
                       (AssertionResult *)"query_update1.values() == update_data1","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_368,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0xb9,(char *)local_298._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_368,(Message *)&local_428);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
            if ((char *)local_298._0_8_ != pcVar3) {
              operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
            }
            if ((long *)local_428.first._M_dataplus._M_p != (long *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) && ((long *)local_428.first._M_dataplus._M_p != (long *)0x0)) {
                (**(code **)(*(long *)local_428.first._M_dataplus._M_p + 8))();
              }
              local_428.first._M_dataplus._M_p = (pointer)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_3d8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_3d8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                        *)local_298,&local_140.m_filter._M_t);
            if (local_270._M_p == (pointer)local_170._M_impl.super__Rb_tree_header._M_node_count) {
              bVar4 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>
                                ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                  )local_298._24_8_,(_Base_ptr)(local_298 + 8),
                                 (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                  )local_170._M_impl.super__Rb_tree_header._M_header._M_left);
            }
            else {
              bVar4 = false;
            }
            local_3d8[0] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )bVar4;
            local_3d8._8_8_ = 0;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                         *)local_298);
            if (local_3d8[0] ==
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )0x0) {
              testing::Message::Message((Message *)&local_428);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_298,(internal *)local_3d8,
                         (AssertionResult *)"query_update1.filter() == filter1","false","true",in_R9
                        );
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_368,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                         ,0xba,(char *)local_298._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_368,(Message *)&local_428);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
              if ((char *)local_298._0_8_ != pcVar3) {
                operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
              }
              if ((long *)local_428.first._M_dataplus._M_p != (long *)0x0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) && ((long *)local_428.first._M_dataplus._M_p != (long *)0x0)) {
                  (**(code **)(*(long *)local_428.first._M_dataplus._M_p + 8))();
                }
                local_428.first._M_dataplus._M_p = (pointer)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_3d8 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_3d8 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              database::Query::Query
                        ((Query *)local_298,
                         "update company.employee set employee_status = fulltime where where employee_join_date >= 20180301 and employee_join_date <= 20190101 and employee_status = parttime"
                        );
              psVar2 = &local_428.first._M_string_length;
              local_428.first._M_dataplus._M_p._0_1_ = local_274 == update;
              local_428.first._M_string_length = 0;
              if (local_274 == update) {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)psVar2,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                psVar2 = &local_428.first._M_string_length;
                local_428.first._M_dataplus._M_p._0_1_ = local_298._32_4_ == dml;
                local_428.first._M_string_length = 0;
                if (local_298._32_4_ == dml) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)psVar2,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  local_3d8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_3d8,local_270._M_p,
                             local_270._M_p + local_268._M_allocated_capacity);
                  iVar5 = std::__cxx11::string::compare(local_3d8);
                  local_428.first._M_dataplus._M_p._0_1_ = iVar5 == 0;
                  local_428.first._M_string_length = 0;
                  if ((char *)local_3d8._0_8_ != pcVar1) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                  psVar2 = &local_428.first._M_string_length;
                  if ((char)local_428.first._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_368);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_3d8,(internal *)&local_428,
                               (AssertionResult *)"query_update2.databaseName() == \"company\"",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_2f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                               ,0xbf,(char *)local_3d8._0_8_);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_2f8,(Message *)&local_368);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
                    if ((char *)local_3d8._0_8_ != pcVar1) {
                      operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                    }
                    if ((long *)local_368._M_impl._0_8_ != (long *)0x0) {
                      bVar4 = testing::internal::IsTrue(true);
                      if ((bVar4) && ((long *)local_368._M_impl._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_368._M_impl._0_8_ + 8))();
                      }
                      local_368._M_impl._0_8_ = (long *)0x0;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)psVar2,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)psVar2,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    local_3d8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_3d8,local_258.first._M_string_length,
                               (pointer)(local_258.first._M_string_length +
                                        local_258.first.field_2._M_allocated_capacity));
                    iVar5 = std::__cxx11::string::compare(local_3d8);
                    local_428.first._M_dataplus._M_p._0_1_ = iVar5 == 0;
                    local_428.first._M_string_length = 0;
                    if ((char *)local_3d8._0_8_ != pcVar1) {
                      operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                    }
                    psVar2 = &local_428.first._M_string_length;
                    if ((char)local_428.first._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_368);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_3d8,(internal *)&local_428,
                                 (AssertionResult *)"query_update2.containerName() == \"employee\"",
                                 "false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_2f8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0xc0,(char *)local_3d8._0_8_);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_2f8,(Message *)&local_368);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
                      if ((char *)local_3d8._0_8_ != pcVar1) {
                        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                      }
                      if ((long *)local_368._M_impl._0_8_ != (long *)0x0) {
                        bVar4 = testing::internal::IsTrue(true);
                        if ((bVar4) && ((long *)local_368._M_impl._0_8_ != (long *)0x0)) {
                          (**(code **)(*(long *)local_368._M_impl._0_8_ + 8))();
                        }
                        local_368._M_impl._0_8_ = (long *)0x0;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)psVar2,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)psVar2,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::pair<const_char_(&)[16],_const_char_(&)[9],_true>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3d8,(char (*) [16])"employee_status",
                                 (char (*) [9])"fulltime");
                      __l_02._M_len = 1;
                      __l_02._M_array = (iterator)local_3d8;
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_368,__l_02,
                            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_428,(allocator_type *)&local_2f8);
                      if ((undefined1 *)CONCAT44(local_3d8._36_4_,local_3d8._32_4_) !=
                          local_3d8 + 0x30) {
                        operator_delete((undefined1 *)CONCAT44(local_3d8._36_4_,local_3d8._32_4_),
                                        local_3d8._48_8_ + 1);
                      }
                      if ((char *)local_3d8._0_8_ != pcVar1) {
                        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                      }
                      local_428.first._M_dataplus._M_p = (pointer)&local_428.first.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_428,"20180301","");
                      local_428.second = greater_or_equal_to;
                      plVar7 = local_3f0;
                      local_400[0] = plVar7;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_400,"20190101","");
                      local_3e0 = 3;
                      __l_03._M_len = 2;
                      __l_03._M_array = &local_428;
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::vector(&local_310,__l_03,&local_429);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::pair<const_char_(&)[19],_true>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                  *)local_3d8,(char (*) [19])"employee_join_date",&local_310);
                      paVar8 = &local_338.first.field_2;
                      local_338.first._M_dataplus._M_p = (pointer)paVar8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_338,"parttime","");
                      local_338.second = equal_to;
                      __l_04._M_len = 1;
                      __l_04._M_array = &local_338;
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::vector(&local_188,__l_04,&local_42a);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::pair<const_char_(&)[16],_true>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                  *)(local_3d8 + 0x38),(char (*) [16])"employee_status",&local_188);
                      __l_05._M_len = 2;
                      __l_05._M_array = (iterator)local_3d8;
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                             *)&local_2f8,__l_05,&local_42b,&local_42c);
                      lVar6 = -0x70;
                      this_00 = local_380;
                      do {
                        std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                                   *)this_00);
                        if ((pointer)(this_00 + -2) != this_00[-4]) {
                          operator_delete(this_00[-4],
                                          (ulong)((((pointer)(this_00 + -2))->first)._M_dataplus.
                                                  _M_p + 1));
                        }
                        this_00 = this_00 + -7;
                        lVar6 = lVar6 + 0x38;
                      } while (lVar6 != 0);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::~vector(&local_188);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_338.first._M_dataplus._M_p != paVar8) {
                        operator_delete(local_338.first._M_dataplus._M_p,
                                        local_338.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::~vector(&local_310);
                      lVar6 = -0x50;
                      do {
                        if (plVar7 != (long *)plVar7[-2]) {
                          operator_delete((long *)plVar7[-2],*plVar7 + 1);
                        }
                        plVar7 = plVar7 + -5;
                        lVar6 = lVar6 + 0x28;
                      } while (lVar6 != 0);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_3d8,&local_200);
                      if (local_3d8._40_8_ == local_368._M_impl.super__Rb_tree_header._M_node_count)
                      {
                        bVar4 = std::__equal<false>::
                                equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                          ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )local_3d8._24_8_,(_Base_ptr)(local_3d8 + 8),
                                           (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )local_368._M_impl.super__Rb_tree_header._M_header.
                                             _M_left);
                      }
                      else {
                        bVar4 = false;
                      }
                      psVar2 = &local_428.first._M_string_length;
                      local_428.first._M_dataplus._M_p._0_1_ = bVar4;
                      local_428.first._M_string_length = 0;
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_3d8);
                      if ((char)local_428.first._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_338);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_3d8,(internal *)&local_428,
                                   (AssertionResult *)"query_update2.values() == update_data2",
                                   "false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_310,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                   ,200,(char *)local_3d8._0_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_310,(Message *)&local_338);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
                        if ((char *)local_3d8._0_8_ != pcVar1) {
                          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_338.first._M_dataplus._M_p !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0) {
                          bVar4 = testing::internal::IsTrue(true);
                          if ((bVar4) &&
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_338.first._M_dataplus._M_p !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0)) {
                            (**(code **)(*(size_type *)local_338.first._M_dataplus._M_p + 8))();
                          }
                          local_338.first._M_dataplus._M_p = (pointer)0x0;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)psVar2,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)psVar2,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                    *)local_3d8,&local_1b8);
                        if (local_3d8._40_8_ ==
                            local_2f8._M_impl.super__Rb_tree_header._M_node_count) {
                          bVar4 = std::__equal<false>::
                                  equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>
                                            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                              )local_3d8._24_8_,(_Base_ptr)(local_3d8 + 8),
                                             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                              )local_2f8._M_impl.super__Rb_tree_header._M_header.
                                               _M_left);
                        }
                        else {
                          bVar4 = false;
                        }
                        local_428.first._M_dataplus._M_p._0_1_ = bVar4;
                        local_428.first._M_string_length = 0;
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                     *)local_3d8);
                        if ((char)local_428.first._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_338);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_3d8,(internal *)&local_428,
                                     (AssertionResult *)"query_update2.filter() == filter2","false",
                                     "true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_310,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                     ,0xc9,(char *)local_3d8._0_8_);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_310,(Message *)&local_338);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310)
                          ;
                          if ((char *)local_3d8._0_8_ != pcVar1) {
                            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_338.first._M_dataplus._M_p !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0) {
                            bVar4 = testing::internal::IsTrue(true);
                            if ((bVar4) &&
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_338.first._M_dataplus._M_p !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0)) {
                              (**(code **)(*(size_type *)local_338.first._M_dataplus._M_p + 8))();
                            }
                            local_338.first._M_dataplus._M_p = (pointer)0x0;
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_428.first._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::~_Rb_tree(&local_2f8);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~_Rb_tree(&local_368);
                    }
                  }
                }
                else {
                  testing::Message::Message((Message *)&local_368);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_3d8,(internal *)&local_428,
                             (AssertionResult *)
                             "query_update2.transactionMetaType() == database::dml","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_2f8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                             ,0xbe,(char *)local_3d8._0_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_2f8,(Message *)&local_368);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
                  if ((char *)local_3d8._0_8_ != pcVar1) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                  if ((long *)local_368._M_impl._0_8_ != (long *)0x0) {
                    bVar4 = testing::internal::IsTrue(true);
                    if ((bVar4) && ((long *)local_368._M_impl._0_8_ != (long *)0x0)) {
                      (**(code **)(*(long *)local_368._M_impl._0_8_ + 8))();
                    }
                    local_368._M_impl._0_8_ = (long *)0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)psVar2,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
              }
              else {
                testing::Message::Message((Message *)&local_368);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_3d8,(internal *)&local_428,
                           (AssertionResult *)"query_update2.transactionType() == database::update",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_2f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xbd,(char *)local_3d8._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_2f8,(Message *)&local_368);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
                if ((char *)local_3d8._0_8_ != pcVar1) {
                  operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                }
                if ((long *)local_368._M_impl._0_8_ != (long *)0x0) {
                  bVar4 = testing::internal::IsTrue(true);
                  if ((bVar4) && ((long *)local_368._M_impl._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_368._M_impl._0_8_ + 8))();
                  }
                  local_368._M_impl._0_8_ = (long *)0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)psVar2,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              database::Query::~Query((Query *)local_298);
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree(&local_170);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_2c8);
        }
      }
    }
    else {
      testing::Message::Message((Message *)&local_428);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_298,(internal *)local_3d8,
                 (AssertionResult *)"query_update1.transactionMetaType() == database::dml","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xae,(char *)local_298._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_428);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      if ((long *)local_428.first._M_dataplus._M_p != (long *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)local_428.first._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_428.first._M_dataplus._M_p + 8))();
        }
        local_428.first._M_dataplus._M_p = (pointer)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_3d8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_3d8,
               (AssertionResult *)"query_update1.transactionType() == database::update","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xad,(char *)local_298._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if ((long *)local_428.first._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_428.first._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_428.first._M_dataplus._M_p + 8))();
      }
      local_428.first._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_3d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  database::Query::~Query(&local_140);
  return;
}

Assistant:

TEST(QueryTests_Update,canDetermineSpecificationForUpdate)
{
  database::Query query_update1 = "update company.employee set employee_name = Tim,employee_status = fulltime where employee_id = 1";
  ASSERT_TRUE(query_update1.transactionType() == database::update);
  ASSERT_TRUE(query_update1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_update1.databaseName() == "company");
  ASSERT_TRUE(query_update1.containerName() == "employee");

  database::api_insert_update_type update_data1 = {
    {"employee_name","Tim"},
    {"employee_status","fulltime"}
  };
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_update1.values() == update_data1);
  ASSERT_TRUE(query_update1.filter() == filter1);

  database::Query query_update2 = "update company.employee set employee_status = fulltime where where employee_join_date >= 20180301 and employee_join_date <= 20190101 and employee_status = parttime";
  ASSERT_TRUE(query_update2.transactionType() == database::update);
  ASSERT_TRUE(query_update2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_update2.databaseName() == "company");
  ASSERT_TRUE(query_update2.containerName() == "employee");
  database::api_insert_update_type update_data2 = {
    {"employee_status","fulltime"}
  };
  database::api_filter_type filter2 = {
    {"employee_join_date",{{"20180301",database::greater_or_equal_to},{"20190101",database::lesser_or_equal_to}}},
    {"employee_status",{{"parttime",database::equal_to}}}
  };
  ASSERT_TRUE(query_update2.values() == update_data2);
  ASSERT_TRUE(query_update2.filter() == filter2);
}